

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_buffer.cpp
# Opt level: O0

uint dxil_spv::emit_buffer_store_values_bitcast
               (Impl *impl,CallInst *instruction,Id *store_values,uint write_mask,RawWidth raw_width
               ,bool is_typed,bool ignore_bitcast)

{
  bool bVar1;
  Id IVar2;
  TypeID TVar3;
  uint width;
  Value *pVVar4;
  Type *data_type;
  Builder *this;
  Operation *pOVar5;
  Operation *op_2;
  Operation *op_1;
  Operation *bitcast_op;
  Operation *op;
  uint i;
  uint raw_vecsize;
  Builder *builder;
  Type *element_type;
  bool ignore_bitcast_local;
  bool is_typed_local;
  RawWidth raw_width_local;
  uint write_mask_local;
  Id *store_values_local;
  CallInst *instruction_local;
  Impl *impl_local;
  
  pVVar4 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,4);
  data_type = LLVMBC::Value::getType(pVVar4);
  this = Converter::Impl::builder(impl);
  op._4_4_ = 0;
  for (op._0_4_ = 0; (uint)op < 4; op._0_4_ = (uint)op + 1) {
    if ((write_mask & 1 << ((byte)(uint)op & 0x1f)) != 0) {
      pVVar4 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,(uint)op + 4);
      Converter::Impl::register_externally_visible_write(impl,pVVar4);
      pVVar4 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,(uint)op + 4);
      IVar2 = Converter::Impl::get_id_for_value(impl,pVVar4,0);
      store_values[(uint)op] = IVar2;
      if (!is_typed) {
        if (((((impl->execution_mode_meta).native_16bit_operations & 1U) == 0) &&
            (((impl->options).min_precision_prefer_native_16bit & 1U) != 0)) &&
           (bVar1 = type_is_16bit(data_type), bVar1)) {
          TVar3 = LLVMBC::Type::getTypeID(data_type);
          if (TVar3 == HalfTyID) {
            IVar2 = spv::Builder::makeFloatType(this,0x20);
            pOVar5 = Converter::Impl::allocate(impl,OpFConvert,IVar2);
            Operation::add_id(pOVar5,store_values[(uint)op]);
            store_values[(uint)op] = pOVar5->id;
            Converter::Impl::add(impl,pOVar5,false);
            if (!ignore_bitcast) {
              IVar2 = spv::Builder::makeUintType(this,0x20);
              pOVar5 = Converter::Impl::allocate(impl,OpBitcast,IVar2);
              Operation::add_id(pOVar5,store_values[(uint)op]);
              Converter::Impl::add(impl,pOVar5,false);
              store_values[(uint)op] = pOVar5->id;
            }
          }
          else {
            IVar2 = spv::Builder::makeUintType(this,0x20);
            pOVar5 = Converter::Impl::allocate(impl,OpUConvert,IVar2);
            Operation::add_id(pOVar5,store_values[(uint)op]);
            store_values[(uint)op] = pOVar5->id;
            Converter::Impl::add(impl,pOVar5,false);
          }
        }
        else if (((!ignore_bitcast) &&
                 (TVar3 = LLVMBC::Type::getTypeID(data_type), TVar3 != DoubleTyID)) &&
                (TVar3 = LLVMBC::Type::getTypeID(data_type), TVar3 != IntegerTyID)) {
          width = raw_width_to_bits(raw_width);
          IVar2 = spv::Builder::makeUintType(this,width);
          pOVar5 = Converter::Impl::allocate(impl,OpBitcast,IVar2);
          Operation::add_id(pOVar5,store_values[(uint)op]);
          store_values[(uint)op] = pOVar5->id;
          Converter::Impl::add(impl,pOVar5,false);
        }
      }
      op._4_4_ = (uint)op + 1;
    }
  }
  return op._4_4_;
}

Assistant:

static unsigned emit_buffer_store_values_bitcast(Converter::Impl &impl, const llvm::CallInst *instruction,
                                                 spv::Id *store_values, unsigned write_mask,
                                                 RawWidth raw_width,
                                                 bool is_typed, bool ignore_bitcast)
{
	auto *element_type = instruction->getOperand(4)->getType();
	auto &builder = impl.builder();
	unsigned raw_vecsize = 0;

	for (unsigned i = 0; i < 4; i++)
	{
		if ((write_mask & (1u << i)) != 0)
		{
			impl.register_externally_visible_write(instruction->getOperand(4 + i));
			store_values[i] = impl.get_id_for_value(instruction->getOperand(4 + i));
			if (!is_typed)
			{
				// If we're storing to min16 types and we use native 16-bit in arithmetic,
				// we have to expand to 32-bit before storing :(
				// This will probably fall over with int vs uint, since we don't know how to sign-extend.
				if (!impl.execution_mode_meta.native_16bit_operations &&
				    impl.options.min_precision_prefer_native_16bit &&
				    type_is_16bit(element_type))
				{
					if (element_type->getTypeID() == llvm::Type::TypeID::HalfTyID)
					{
						Operation *op = impl.allocate(spv::OpFConvert, builder.makeFloatType(32));
						op->add_id(store_values[i]);
						store_values[i] = op->id;
						impl.add(op);

						if (!ignore_bitcast)
						{
							Operation *bitcast_op = impl.allocate(spv::OpBitcast, builder.makeUintType(32));
							bitcast_op->add_id(store_values[i]);
							impl.add(bitcast_op);
							store_values[i] = bitcast_op->id;
						}
					}
					else
					{
						// SConvert or UConvert, who knows. :)
						Operation *op = impl.allocate(spv::OpUConvert, builder.makeUintType(32));
						op->add_id(store_values[i]);
						store_values[i] = op->id;
						impl.add(op);
					}
				}
				else if (!ignore_bitcast &&
				         element_type->getTypeID() != llvm::Type::TypeID::DoubleTyID &&
				         element_type->getTypeID() != llvm::Type::TypeID::IntegerTyID)
				{
					Operation *op = impl.allocate(spv::OpBitcast, builder.makeUintType(raw_width_to_bits(raw_width)));
					op->add_id(store_values[i]);
					store_values[i] = op->id;
					impl.add(op);
				}
			}

			raw_vecsize = i + 1;
		}
	}

	return raw_vecsize;
}